

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *input_mask_p;
  AggregateInputData *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat sdata_2;
  UnifiedVectorFormat idata_2;
  QuantileState<int,_duckdb::QuantileStandardType> **sdata_1;
  int *idata_1;
  AggregateUnaryInput input_data;
  QuantileState<int,_duckdb::QuantileStandardType> **sdata;
  int *idata;
  idx_t in_stack_fffffffffffffed8;
  UnifiedVectorFormat *in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  UnifiedVectorFormat *in_stack_fffffffffffffef0;
  ValidityMask *in_stack_ffffffffffffff28;
  SelectionVector *in_stack_ffffffffffffff30;
  SelectionVector *in_stack_ffffffffffffff38;
  QuantileState<int,_duckdb::QuantileStandardType> **in_stack_ffffffffffffff40;
  AggregateInputData *in_stack_ffffffffffffff48;
  QuantileState<int,_duckdb::QuantileStandardType> **in_stack_ffffffffffffff50;
  AggregateInputData *in_stack_ffffffffffffff58;
  SelectionVector *in_stack_ffffffffffffff60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  AggregateUnaryInput local_48;
  QuantileState<int,_duckdb::QuantileStandardType> **local_30;
  int *local_28;
  AggregateInputData *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if ((VVar1 == CONSTANT_VECTOR) &&
     (VVar1 = Vector::GetVectorType(local_10), VVar1 == CONSTANT_VECTOR)) {
    bVar2 = QuantileOperation::IgnoreNull();
    if ((!bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0x1d4cf49), !bVar2)) {
      local_28 = ConstantVector::GetData<int>((Vector *)0x1d4cf61);
      local_30 = ConstantVector::GetData<duckdb::QuantileState<int,duckdb::QuantileStandardType>*>
                           ((Vector *)0x1d4cf76);
      input_mask_p = ConstantVector::Validity(local_8);
      AggregateUnaryInput::AggregateUnaryInput(&local_48,local_18,input_mask_p);
      QuantileOperation::
      ConstantOperation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<int,true>>
                ((QuantileState<int,_duckdb::QuantileStandardType> *)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,(AggregateUnaryInput *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
    }
  }
  else {
    VVar1 = Vector::GetVectorType(local_8);
    if ((VVar1 == FLAT_VECTOR) && (VVar1 = Vector::GetVectorType(local_10), VVar1 == FLAT_VECTOR)) {
      FlatVector::GetData<int>((Vector *)0x1d4d011);
      FlatVector::GetData<duckdb::QuantileState<int,duckdb::QuantileStandardType>*>
                ((Vector *)0x1d4d026);
      FlatVector::Validity((Vector *)0x1d4d062);
      UnaryFlatLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
                ((int *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50,(ValidityMask *)in_stack_ffffffffffffff48,
                 (idx_t)in_stack_ffffffffffffff40);
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
      UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
      Vector::ToUnifiedFormat
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (UnifiedVectorFormat *)in_stack_ffffffffffffffa0._M_pi);
      Vector::ToUnifiedFormat
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (UnifiedVectorFormat *)in_stack_ffffffffffffffa0._M_pi);
      UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)&stack0xffffffffffffff60);
      UnaryScatterLoop<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,true>>
                ((int *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(idx_t)in_stack_ffffffffffffff60);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffee0);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffee0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}